

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O3

_Bool object_curses_find_element(player *p,object *obj,wchar_t elem)

{
  angband_constants *paVar1;
  size_t sVar2;
  int *piVar3;
  size_t sVar4;
  long lVar5;
  angband_constants *paVar6;
  uint uVar7;
  char o_name [80];
  char local_88 [88];
  
  paVar1 = (angband_constants *)object_desc(local_88,0x50,obj,0,p);
  if ((obj->curses != (curse_data *)0x0) && (paVar1 = z_info, 1 < z_info->curse_max)) {
    paVar6 = (angband_constants *)0x1;
    do {
      uVar7 = 0xffffffff;
      if (rune_max != 0) {
        piVar3 = &rune_list->index;
        sVar4 = 0;
        do {
          if ((((rune *)(piVar3 + -1))->variety == RUNE_VAR_CURSE) &&
             (paVar6 == (angband_constants *)(ulong)(uint)*piVar3)) {
            uVar7 = (uint)sVar4;
            break;
          }
          sVar4 = sVar4 + 1;
          piVar3 = piVar3 + 6;
        } while (rune_max != sVar4);
      }
      if (((obj->curses[(long)paVar6].power != L'\0') && (curses[(long)paVar6].obj != (object *)0x0)
          ) && ((curses[(long)paVar6].obj)->el_info[elem].res_level != 100)) {
        if (p->obj_k->el_info[elem].res_level == 0) {
          msg("Your %s glows.",local_88);
          sVar4 = 0xffffffffffffffff;
          if (rune_max != 0) {
            piVar3 = &rune_list->index;
            lVar5 = 0;
            sVar2 = rune_max;
            do {
              if ((((rune *)(piVar3 + -1))->variety == RUNE_VAR_RESIST) && (*piVar3 == elem)) {
                sVar4 = lVar5 >> 0x20;
                break;
              }
              lVar5 = lVar5 + 0x100000000;
              piVar3 = piVar3 + 6;
              sVar2 = sVar2 - 1;
            } while (sVar2 != 0);
          }
          player_learn_rune(p,sVar4,true);
        }
        if (-1 < (int)uVar7) {
          player_learn_rune(p,(ulong)uVar7,true);
        }
      }
      paVar6 = (angband_constants *)((long)&paVar6->f_max + 1);
      paVar1 = (angband_constants *)(ulong)z_info->curse_max;
    } while (paVar6 < paVar1);
  }
  return SUB81(paVar1,0);
}

Assistant:

static bool object_curses_find_element(struct player *p, struct object *obj, int elem)
{
	char o_name[80];
	bool new = false;

	object_desc(o_name, sizeof(o_name), obj, ODESC_BASE, p);
	if (obj->curses) {
		int i;

		for (i = 1; i < z_info->curse_max; i++) {
			int index = rune_index(RUNE_VAR_CURSE, i);

			if (!obj->curses[i].power || !curses[i].obj)
				continue;

			/* Does the object affect the player's resistance to the element? */
			if (curses[i].obj->el_info[elem].res_level != RES_LEVEL_BASE) {
				/* Learn the element properties if we don't know yet */
				if (!p->obj_k->el_info[elem].res_level) {
					msg("Your %s glows.", o_name);

					player_learn_rune(p, rune_index(RUNE_VAR_RESIST, elem),
									  true);
				}

				/* Learn the curse */
				if (index >= 0) {
					player_learn_rune(p, index, true);
				}
				new = true;
			}
		}
	}
	return new;
}